

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_enemy.cpp
# Opt level: O0

bool CheckBossDeath(AActor *actor)

{
  uint uVar1;
  MetaClass *pMVar2;
  MetaClass *pMVar3;
  bool bVar4;
  TFlags<ActorFlag,_unsigned_int> local_44;
  AActor *local_40;
  AActor *other;
  TThinkerIterator<AActor> iterator;
  int i;
  AActor *actor_local;
  
  iterator.super_FThinkerIterator._20_4_ = 0;
  while (((int)iterator.super_FThinkerIterator._20_4_ < 8 &&
         (((playeringame[(int)iterator.super_FThinkerIterator._20_4_] & 1U) == 0 ||
          ((int)(&DAT_01ae7158)[(long)(int)iterator.super_FThinkerIterator._20_4_ * 0xa8] < 1))))) {
    iterator.super_FThinkerIterator._20_4_ = iterator.super_FThinkerIterator._20_4_ + 1;
  }
  if (iterator.super_FThinkerIterator._20_4_ != 8) {
    TThinkerIterator<AActor>::TThinkerIterator((TThinkerIterator<AActor> *)&other,0x80);
    do {
      local_40 = TThinkerIterator<AActor>::Next((TThinkerIterator<AActor> *)&other,false);
      if (local_40 == (AActor *)0x0) {
        return true;
      }
      bVar4 = false;
      if (local_40 != actor) {
        if (local_40->health < 1) {
          TFlags<ActorFlag,_unsigned_int>::operator&
                    (&local_44,
                     (int)local_40 +
                     (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_AMBUSH|MF_NOBLOCKMAP|MF_NOSECTOR|
                     MF_SHOOTABLE));
          uVar1 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_44);
          bVar4 = false;
          if (uVar1 == 0) goto LAB_0055347d;
        }
        pMVar2 = AActor::GetClass(local_40);
        pMVar3 = AActor::GetClass(actor);
        bVar4 = pMVar2 == pMVar3;
      }
LAB_0055347d:
    } while (!bVar4);
  }
  return false;
}

Assistant:

bool CheckBossDeath (AActor *actor)
{
	int i;

	// make sure there is a player alive for victory
	for (i = 0; i < MAXPLAYERS; i++)
		if (playeringame[i] && players[i].health > 0)
			break;
	
	if (i == MAXPLAYERS)
		return false; // no one left alive, so do not end game
	
	// Make sure all bosses are dead
	TThinkerIterator<AActor> iterator;
	AActor *other;

	while ( (other = iterator.Next ()) )
	{
		if (other != actor &&
			(other->health > 0 || (other->flags & MF_ICECORPSE))
			&& other->GetClass() == actor->GetClass())
		{ // Found a living boss
		  // [RH] Frozen bosses don't count as dead until they shatter
			return false;
		}
	}
	// The boss death is good
	return true;
}